

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  _Rb_tree_header *p_Var1;
  ulong __n;
  byte bVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  uint uVar6;
  _Base_ptr p_Var7;
  int iVar8;
  char *__s;
  bool bVar9;
  bool bVar10;
  Video *media;
  Video *local_38;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  __s = __return_storage_ptr__->data + 1;
  memset(__s,0x1b,0x3ff);
  __n = (tex->relativeFileName)._M_string_length;
  if (__n < 0x400) {
    __return_storage_ptr__->length = (ai_uint32)__n;
    memcpy(__return_storage_ptr__->data,(tex->relativeFileName)._M_dataplus._M_p,__n);
    __return_storage_ptr__->data[__n] = '\0';
  }
  local_38 = tex->media;
  if (local_38 == (Video *)0x0) {
    return __return_storage_ptr__;
  }
  p_Var7 = (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(Video **)(p_Var7 + 1) >= local_38) {
        p_Var4 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(Video **)(p_Var7 + 1) < local_38];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(Video **)(p_Var4 + 1) <= local_38)) {
      uVar3 = *(uint *)&p_Var4[1]._M_parent;
      goto LAB_00176052;
    }
  }
  if (local_38->contentLength == 0) {
    return __return_storage_ptr__;
  }
  uVar3 = ConvertVideo(this,local_38);
  pmVar5 = std::
           map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
           ::operator[](&this->textures_converted,&local_38);
  *pmVar5 = uVar3;
LAB_00176052:
  if (this->doc->settings->useLegacyEmbeddedTextureNaming == true) {
    __return_storage_ptr__->data[0] = '*';
    uVar6 = 1;
    if ((int)uVar3 < 0) {
      __s = __return_storage_ptr__->data + 2;
      __return_storage_ptr__->data[1] = '-';
      uVar3 = -uVar3;
      uVar6 = 2;
    }
    iVar8 = 1000000000;
    bVar2 = 0;
    do {
      bVar9 = (int)((long)(int)uVar3 / (long)iVar8) != 0;
      bVar10 = iVar8 == 1;
      if ((bool)(bVar2 | bVar10 | bVar9)) {
        *__s = (char)((long)(int)uVar3 / (long)iVar8) + '0';
        __s = __s + 1;
        uVar6 = uVar6 + 1;
        uVar3 = (int)uVar3 % iVar8;
        if (iVar8 == 1) break;
      }
      iVar8 = iVar8 / 10;
      bVar2 = bVar2 | bVar10 | bVar9;
    } while (uVar6 < 0x3ff);
    *__s = '\0';
    __return_storage_ptr__->length = uVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }